

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O3

bool __thiscall
rapidjson::
GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
::BeginValue(GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
             *this)

{
  char cVar1;
  undefined4 uVar2;
  uint uVar3;
  char *pcVar4;
  SchemaType *pSVar5;
  long lVar6;
  bool bVar7;
  int iVar8;
  SchemaValidationContext<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
  *pSVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  SizeType i;
  ulong uVar10;
  char *pcVar11;
  ulong uVar12;
  
  pcVar11 = (this->schemaStack_).stackTop_;
  pcVar4 = (this->schemaStack_).stack_;
  if (pcVar11 == pcVar4) {
    pSVar5 = this->root_;
    pSVar9 = internal::Stack<rapidjson::CrtAllocator>::
             Push<rapidjson::internal::SchemaValidationContext<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>>>
                       (&this->schemaStack_,1);
    uVar3 = this->flags_;
    pSVar9->factory =
         &this->
          super_ISchemaStateFactory<rapidjson::internal::Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>_>
    ;
    pSVar9->error_handler =
         &this->
          super_IValidationErrorHandler<rapidjson::internal::Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>_>
    ;
    pSVar9->schema = pSVar5;
    pSVar9->flags = uVar3;
    pSVar9->patternPropertiesValidators = (ISchemaValidator **)0x0;
    pSVar9->patternPropertiesValidatorCount = 0;
    pSVar9->invalidCode = kValidateErrorNone;
    pSVar9->valueSchema = (SchemaType *)0x0;
    pSVar9->invalidKeyword = (Ch *)0x0;
    *(undefined8 *)((long)&pSVar9->arrayElementHashCodes + 4) = 0;
    *(undefined8 *)((long)&pSVar9->validators + 4) = 0;
    pSVar9->hasher = (void *)0x0;
    pSVar9->arrayElementHashCodes = (void *)0x0;
    pSVar9->patternPropertiesSchemas = (SchemaType **)0x0;
    pSVar9->patternPropertiesSchemaCount = 0;
    pSVar9->valuePatternValidatorType = kPatternValidatorOnly;
    *(undefined4 *)((long)&pSVar9->propertyExist + 7) = 0;
    pSVar9->propertyExist = (bool *)0x0;
    return true;
  }
  if (0x8f < (ulong)((long)pcVar11 - (long)pcVar4)) {
    if (pcVar11[-8] == '\x01') {
      internal::TokenHelper<rapidjson::internal::Stack<rapidjson::CrtAllocator>,_char>::
      AppendIndexToken(&this->documentStack_,*(SizeType *)(pcVar11 + -0x14));
      pcVar11 = (this->schemaStack_).stackTop_;
      if ((ulong)((long)pcVar11 - (long)(this->schemaStack_).stack_) < 0x90) {
        __assert_fail("GetSize() >= sizeof(T)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/internal/stack.h"
                      ,0x98,
                      "const T *rapidjson::internal::Stack<rapidjson::CrtAllocator>::Top() const [Allocator = rapidjson::CrtAllocator, T = rapidjson::internal::SchemaValidationContext<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<>>>>]"
                     );
      }
    }
    bVar7 = internal::
            Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
            ::BeginValue(*(Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
                           **)(pcVar11 + -0x80),(Context *)(pcVar11 + -0x90));
    if ((!bVar7) && ((this->flags_ & 1) == 0)) {
      return false;
    }
    pcVar11 = (this->schemaStack_).stackTop_;
    if (0x8f < (ulong)((long)pcVar11 - (long)(this->schemaStack_).stack_)) {
      pSVar5 = *(SchemaType **)(pcVar11 + -0x70);
      if (pSVar5 == (SchemaType *)0x0) {
        __assert_fail("CurrentContext().valueSchema",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/schema.h"
                      ,0xbb3,
                      "bool rapidjson::GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<>>>>::BeginValue() [SchemaDocumentType = rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<>>>, OutputHandler = rapidjson::BaseReaderHandler<>, StateAllocator = rapidjson::CrtAllocator]"
                     );
      }
      uVar12 = (ulong)*(uint *)(pcVar11 + -0x20);
      lVar6 = *(long *)(pcVar11 + -0x28);
      uVar2 = *(undefined4 *)(pcVar11 + -0x1c);
      cVar1 = pcVar11[-7];
      pSVar9 = internal::Stack<rapidjson::CrtAllocator>::
               Push<rapidjson::internal::SchemaValidationContext<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>>>
                         (&this->schemaStack_,1);
      uVar3 = this->flags_;
      pSVar9->factory =
           &this->
            super_ISchemaStateFactory<rapidjson::internal::Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>_>
      ;
      pSVar9->error_handler =
           &this->
            super_IValidationErrorHandler<rapidjson::internal::Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>_>
      ;
      pSVar9->schema = pSVar5;
      pSVar9->flags = uVar3;
      pSVar9->patternPropertiesValidators = (ISchemaValidator **)0x0;
      pSVar9->patternPropertiesValidatorCount = 0;
      pSVar9->invalidCode = kValidateErrorNone;
      pSVar9->valueSchema = (SchemaType *)0x0;
      pSVar9->invalidKeyword = (Ch *)0x0;
      *(undefined8 *)((long)&pSVar9->arrayElementHashCodes + 4) = 0;
      *(undefined8 *)((long)&pSVar9->validators + 4) = 0;
      pSVar9->hasher = (void *)0x0;
      pSVar9->arrayElementHashCodes = (void *)0x0;
      pSVar9->patternPropertiesSchemas = (SchemaType **)0x0;
      pSVar9->patternPropertiesSchemaCount = 0;
      pSVar9->valuePatternValidatorType = kPatternValidatorOnly;
      *(undefined4 *)((long)&pSVar9->propertyExist + 7) = 0;
      pSVar9->propertyExist = (bool *)0x0;
      if (uVar12 != 0) {
        pcVar11 = (this->schemaStack_).stackTop_;
        if ((ulong)((long)pcVar11 - (long)(this->schemaStack_).stack_) < 0x90) goto LAB_00147a55;
        *(undefined4 *)(pcVar11 + -0x18) = uVar2;
        iVar8 = (*(this->
                  super_ISchemaStateFactory<rapidjson::internal::Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>_>
                  )._vptr_ISchemaStateFactory[7])(this);
        *(void **)(pcVar11 + -0x38) = (void *)CONCAT44(extraout_var,iVar8);
        uVar10 = 0;
        memset((void *)CONCAT44(extraout_var,iVar8),0,uVar12 * 8);
        do {
          iVar8 = (*(this->
                    super_ISchemaStateFactory<rapidjson::internal::Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>_>
                    )._vptr_ISchemaStateFactory[2])(this,*(undefined8 *)(lVar6 + uVar10 * 8),1);
          uVar3 = *(uint *)(pcVar11 + -0x30);
          *(uint *)(pcVar11 + -0x30) = uVar3 + 1;
          *(ulong *)(*(long *)(pcVar11 + -0x38) + (ulong)uVar3 * 8) =
               CONCAT44(extraout_var_00,iVar8);
          uVar10 = uVar10 + 1;
        } while (uVar12 != uVar10);
      }
      pcVar11 = (this->schemaStack_).stackTop_;
      if (0x8f < (ulong)((long)pcVar11 - (long)(this->schemaStack_).stack_)) {
        pcVar11[-6] = cVar1;
        return true;
      }
    }
  }
LAB_00147a55:
  __assert_fail("GetSize() >= sizeof(T)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/internal/stack.h"
                ,0x92,
                "T *rapidjson::internal::Stack<rapidjson::CrtAllocator>::Top() [Allocator = rapidjson::CrtAllocator, T = rapidjson::internal::SchemaValidationContext<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<>>>>]"
               );
}

Assistant:

bool BeginValue() {
        RAPIDJSON_SCHEMA_PRINT(Method, "GenericSchemaValidator::BeginValue");
        if (schemaStack_.Empty())
            PushSchema(root_);
        else {
            if (CurrentContext().inArray)
                internal::TokenHelper<internal::Stack<StateAllocator>, Ch>::AppendIndexToken(documentStack_, CurrentContext().arrayElementIndex);

            if (!CurrentSchema().BeginValue(CurrentContext()) && !GetContinueOnErrors())
                return false;

            SizeType count = CurrentContext().patternPropertiesSchemaCount;
            const SchemaType** sa = CurrentContext().patternPropertiesSchemas;
            typename Context::PatternValidatorType patternValidatorType = CurrentContext().valuePatternValidatorType;
            bool valueUniqueness = CurrentContext().valueUniqueness;
            RAPIDJSON_ASSERT(CurrentContext().valueSchema);
            PushSchema(*CurrentContext().valueSchema);

            if (count > 0) {
                CurrentContext().objectPatternValidatorType = patternValidatorType;
                ISchemaValidator**& va = CurrentContext().patternPropertiesValidators;
                SizeType& validatorCount = CurrentContext().patternPropertiesValidatorCount;
                va = static_cast<ISchemaValidator**>(MallocState(sizeof(ISchemaValidator*) * count));
                std::memset(va, 0, sizeof(ISchemaValidator*) * count);
                for (SizeType i = 0; i < count; i++)
                    va[validatorCount++] = CreateSchemaValidator(*sa[i], true);  // Inherit continueOnError
            }

            CurrentContext().arrayUniqueness = valueUniqueness;
        }
        return true;
    }